

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void handle_pong_frame(cio_websocket *websocket,uint8_t *data,uint_fast8_t length)

{
  cio_http_client *pcVar1;
  cio_error err_00;
  cio_error err;
  cio_http_client *client;
  uint_fast8_t length_local;
  uint8_t *data_local;
  cio_websocket *websocket_local;
  
  if (websocket->on_control !=
      (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0) {
    (*websocket->on_control)(websocket,CIO_WEBSOCKET_PONG_FRAME,data,length);
  }
  pcVar1 = (websocket->ws_private).http_client;
  err_00 = cio_buffered_stream_read_at_least
                     (&pcVar1->buffered_stream,&pcVar1->rb,1,get_header,websocket);
  if (err_00 != CIO_SUCCESS) {
    handle_error(websocket,err_00,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                 "could not restart receiving handling a pong frame received");
  }
  return;
}

Assistant:

static void handle_pong_frame(struct cio_websocket *websocket, uint8_t *data, uint_fast8_t length)
{
	if (websocket->on_control != NULL) {
		websocket->on_control(websocket, CIO_WEBSOCKET_PONG_FRAME, data, length);
	}

	struct cio_http_client *client = websocket->ws_private.http_client;
	enum cio_error err = cio_buffered_stream_read_at_least(&client->buffered_stream, &client->rb, 1, get_header, websocket);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "could not restart receiving handling a pong frame received");
	}
}